

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O3

bool __thiscall cmCTestBZR::LoadModifications(cmCTestBZR *this)

{
  pointer pcVar1;
  cmCTestBZR *pcVar2;
  cmCTestBZR *pcVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string bzr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bzr_status;
  OutputLogger err;
  StatusParser out;
  string local_338;
  long *local_318;
  long local_310;
  long local_308 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  OutputLogger local_2e0;
  undefined1 local_2a0 [32];
  char *local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  cmCTestBZR *local_260 [2];
  char *local_38;
  
  pcVar1 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_318 = local_308;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_318,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_string_length
            );
  local_2a0._0_8_ = local_2a0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2a0,local_318,local_310 + (long)local_318);
  local_280 = local_278._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"status","");
  pcVar3 = (cmCTestBZR *)&stack0xfffffffffffffdb0;
  local_260[0] = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"-SV","");
  __l._M_len = 3;
  __l._M_array = (iterator)local_2a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2f8,__l,(allocator_type *)&local_2e0);
  lVar4 = -0x60;
  do {
    pcVar2 = (cmCTestBZR *)pcVar3[-1].URL.field_2._M_allocated_capacity;
    if (pcVar3 != pcVar2) {
      operator_delete(pcVar2,(long)(pcVar3->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC +
                             1);
    }
    pcVar3 = (cmCTestBZR *)&pcVar3[-1].URL;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  StatusParser::StatusParser((StatusParser *)local_2a0,this,"status-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_2e0,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"status-err> ");
  local_338._M_string_length = 0;
  local_338.field_2._M_local_buf[0] = '\0';
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  cmCTestVC::RunChild((cmCTestVC *)this,&local_2f8,(OutputParser *)local_2a0,
                      (OutputParser *)&local_2e0,&local_338,Auto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,
                    CONCAT71(local_338.field_2._M_allocated_capacity._1_7_,
                             local_338.field_2._M_local_buf[0]) + 1);
  }
  local_2e0.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00bbdac8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0.super_LineParser.Line._M_dataplus._M_p !=
      &local_2e0.super_LineParser.Line.field_2) {
    operator_delete(local_2e0.super_LineParser.Line._M_dataplus._M_p,
                    local_2e0.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_2a0._0_8_ = &PTR__StatusParser_00bba288;
  if (local_38 != (char *)0x0) {
    operator_delete__(local_38);
  }
  local_2a0._0_8_ = &PTR__LineParser_00bbdac8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._24_8_ != &local_278) {
    operator_delete((void *)local_2a0._24_8_,local_278._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2f8);
  if (local_318 != local_308) {
    operator_delete(local_318,local_308[0] + 1);
  }
  return true;
}

Assistant:

bool cmCTestBZR::LoadModifications()
{
  // Run "bzr status" which reports local modifications.
  std::string bzr = this->CommandLineTool;
  std::vector<std::string> bzr_status = { bzr, "status", "-SV" };
  StatusParser out(this, "status-out> ");
  OutputLogger err(this->Log, "status-err> ");
  this->RunChild(bzr_status, &out, &err);
  return true;
}